

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

uint16_t parseNumber(char **string,char *errPrefix,uint16_t errVal)

{
  uint8_t uVar1;
  byte bVar2;
  undefined6 in_register_00000012;
  ushort uVar3;
  char *pcVar4;
  uchar *puVar5;
  uchar uVar6;
  long lStack_50;
  uint8_t base;
  undefined4 local_44;
  char *local_40;
  anon_class_8_1_8989b3cf charIndex;
  
  base = '\n';
  puVar5 = (uchar *)*string;
  uVar6 = *puVar5;
  uVar3 = 10;
  pcVar4 = "";
  if (uVar6 == '0') {
    uVar6 = puVar5[1];
    if (uVar6 == 'B') {
LAB_00105009:
      base = '\x02';
      uVar3 = 2;
    }
    else {
      if (uVar6 != 'x') {
        if (uVar6 == 'b') goto LAB_00105009;
        if (uVar6 != 'X') goto LAB_00105022;
      }
      base = '\x10';
      uVar3 = 0x10;
    }
    lStack_50 = 2;
  }
  else {
    if (uVar6 == '$') {
      base = '\x10';
      uVar3 = 0x10;
    }
    else {
      if (uVar6 != '%') {
        if (uVar6 == '\0') {
          error("%s: expected number, but found nothing");
          return errVal;
        }
        goto LAB_00105022;
      }
      base = '\x02';
      uVar3 = 2;
    }
    lStack_50 = 1;
  }
  puVar5 = puVar5 + lStack_50;
  *string = (char *)puVar5;
  pcVar4 = " after base";
LAB_00105022:
  charIndex.base = &base;
  uVar6 = *puVar5;
  local_40 = errPrefix;
  uVar1 = parseNumber::anon_class_8_1_8989b3cf::operator()(&charIndex,uVar6);
  if (uVar1 == 0xff) {
    error("%s: expected digit%s, but found nothing",local_40,pcVar4);
  }
  else {
    local_44 = (undefined4)CONCAT62(in_register_00000012,errVal);
    errVal = 0;
    do {
      puVar5 = puVar5 + 1;
      bVar2 = parseNumber::anon_class_8_1_8989b3cf::operator()(&charIndex,uVar6);
      if (bVar2 == 0xff) {
        return errVal;
      }
      *string = (char *)puVar5;
      errVal = errVal * uVar3 + (ushort)bVar2;
      if ((ushort)(0xffff / uVar3) <= errVal) {
        error("%s: the number is too large!",local_40,(ulong)(ushort)(0xffff % (uint)uVar3));
        return (uint16_t)local_44;
      }
      uVar6 = *puVar5;
    } while (uVar6 != '\0');
  }
  return errVal;
}

Assistant:

static uint16_t parseNumber(char *&string, char const *errPrefix, uint16_t errVal = UINT16_MAX) {
	uint8_t base = 10;
	if (*string == '\0') {
		error("%s: expected number, but found nothing", errPrefix);
		return errVal;
	} else if (*string == '$') {
		base = 16;
		++string;
	} else if (*string == '%') {
		base = 2;
		++string;
	} else if (*string == '0' && string[1] != '\0') {
		// Check if we have a "0x" or "0b" here
		if (string[1] == 'x' || string[1] == 'X') {
			base = 16;
			string += 2;
		} else if (string[1] == 'b' || string[1] == 'B') {
			base = 2;
			string += 2;
		}
	}

	/*
	 * Turns a digit into its numeric value in the current base, if it has one.
	 * Maximum is inclusive. The string_view is modified to "consume" all digits.
	 * Returns 255 on parse failure (including wrong char for base), in which case
	 * the string_view may be pointing on garbage.
	 */
	auto charIndex = [&base](unsigned char c) -> uint8_t {
		unsigned char index = c - '0'; // Use wrapping semantics
		if (base == 2 && index >= 2) {
			return 255;
		} else if (index < 10) {
			return index;
		} else if (base != 16) {
			return 255; // Letters are only valid in hex
		}
		index = tolower(c) - 'a'; // OK because we pass an `unsigned char`
		if (index < 6) {
			return index + 10;
		}
		return 255;
	};

	if (charIndex(*string) == 255) {
		error("%s: expected digit%s, but found nothing", errPrefix,
		      base != 10 ? " after base" : "");
		return errVal;
	}
	uint16_t number = 0;
	do {
		// Read a character, and check if it's valid in the given base
		uint8_t index = charIndex(*string);
		if (index == 255) {
			break; // Found an invalid character, end
		}
		++string;

		number *= base;
		number += index;
		// The lax check covers the addition on top of the multiplication
		if (number >= UINT16_MAX / base) {
			error("%s: the number is too large!", errPrefix);
			return errVal;
		}
	} while (*string != '\0'); // No more characters?

	return number;
}